

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O2

int enet_packet_resize(ENetPacket *packet,size_t dataLength)

{
  enet_uint8 *__dest;
  
  if ((packet->dataLength < dataLength) && ((packet->flags & 4) == 0)) {
    __dest = (enet_uint8 *)enet_malloc(dataLength);
    if (__dest == (enet_uint8 *)0x0) {
      return -1;
    }
    memcpy(__dest,packet->data,packet->dataLength);
    enet_free(packet->data);
    packet->data = __dest;
  }
  packet->dataLength = dataLength;
  return 0;
}

Assistant:

int
enet_packet_resize (ENetPacket * packet, size_t dataLength)
{
    enet_uint8 * newData;
   
    if (dataLength <= packet -> dataLength || (packet -> flags & ENET_PACKET_FLAG_NO_ALLOCATE))
    {
       packet -> dataLength = dataLength;

       return 0;
    }

    newData = (enet_uint8 *) enet_malloc (dataLength);
    if (newData == NULL)
      return -1;

    memcpy (newData, packet -> data, packet -> dataLength);
    enet_free (packet -> data);
    
    packet -> data = newData;
    packet -> dataLength = dataLength;

    return 0;
}